

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode InitiateTransfer(Curl_easy *data)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_29;
  connectdata *pcStack_28;
  _Bool connected;
  connectdata *conn;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pcStack_28 = data->conn;
  pCStack_18 = data;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ftp.log_level)) {
    Curl_trc_ftp(data,"InitiateTransfer()");
  }
  if (((((ulong)pcStack_28->bits >> 0x11 & 1) != 0) &&
      ((*(ulong *)&(pCStack_18->set).field_0x8ca >> 0xc & 1) != 0)) &&
     (_Var1 = Curl_conn_is_ssl(pcStack_28,1), !_Var1)) {
    CVar2 = Curl_ssl_cfilter_add(pCStack_18,pcStack_28,1);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    conn._4_4_ = 0;
  }
  conn._4_4_ = Curl_conn_connect(pCStack_18,1,true,&local_29);
  data_local._4_4_ = conn._4_4_;
  if ((conn._4_4_ == CURLE_OK) && ((local_29 & 1U) != 0)) {
    if ((pcStack_28->proto).ftpc.state_saved == '!') {
      Curl_pgrsSetUploadSize(pCStack_18,(pCStack_18->state).infilesize);
      Curl_xfer_setup2(pCStack_18,2,-1,true,true);
    }
    else {
      Curl_xfer_setup2(pCStack_18,1,(pcStack_28->proto).ftpc.retr_size_saved,true,false);
    }
    *(undefined1 *)((long)&pcStack_28->proto + 8) = 1;
    _ftp_state(pCStack_18,'\0');
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode InitiateTransfer(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  bool connected;

  CURL_TRC_FTP(data, "InitiateTransfer()");
  if(conn->bits.ftp_use_data_ssl && data->set.ftp_use_port &&
     !Curl_conn_is_ssl(conn, SECONDARYSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, SECONDARYSOCKET);
    if(result)
      return result;
  }
  result = Curl_conn_connect(data, SECONDARYSOCKET, TRUE, &connected);
  if(result || !connected)
    return result;

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    /* When we know we are uploading a specified file, we can get the file
       size prior to the actual upload. */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbuf_init(conn->sock[SECONDARYSOCKET]);

    /* FTP upload, shutdown DATA, ignore shutdown errors, as we rely
     * on the server response on the CONTROL connection. */
    Curl_xfer_setup2(data, CURL_XFER_SEND, -1, TRUE, TRUE);
  }
  else {
    /* FTP download, shutdown, do not ignore errors */
    Curl_xfer_setup2(data, CURL_XFER_RECV,
                     conn->proto.ftpc.retr_size_saved, TRUE, FALSE);
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  ftp_state(data, FTP_STOP);

  return CURLE_OK;
}